

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

void __thiscall kratos::SwitchStmt::set_parent(SwitchStmt *this,IRNode *parent)

{
  bool bVar1;
  reference ppVar2;
  element_type *peVar3;
  pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_> *iter;
  iterator __end1;
  iterator __begin1;
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  *__range1;
  IRNode *parent_local;
  SwitchStmt *this_local;
  
  Stmt::set_parent(&this->super_Stmt,parent);
  __end1 = std::
           map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
           ::begin(&this->body_);
  iter = (pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_> *)
         std::
         map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
         ::end(&this->body_);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&iter);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>
             ::operator*(&__end1);
    peVar3 = std::
             __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&ppVar2->second);
    (*(peVar3->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[7])(peVar3,this);
    std::
    _Rb_tree_iterator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void SwitchStmt::set_parent(IRNode *parent) {
    Stmt::set_parent(parent);
    for (auto &iter : body_) {
        iter.second->set_parent(this);
    }
}